

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O3

void __thiscall CEPlanet::UpdatePosition(CEPlanet *this,double *jd)

{
  double dVar1;
  long lVar2;
  
  dVar1 = *jd;
  if (-1e+29 <= dVar1) {
    if ((dVar1 != this->cached_jd_) || (NAN(dVar1) || NAN(this->cached_jd_))) {
      if (this->algorithm_type_ == JPL) {
        lVar2 = 0x78;
      }
      else {
        if (this->algorithm_type_ != SOFA) {
          return;
        }
        lVar2 = 0x80;
      }
      (**(code **)((long)(this->super_CEBody).super_CESkyCoord._vptr_CESkyCoord + lVar2))();
      return;
    }
  }
  return;
}

Assistant:

void CEPlanet::UpdatePosition(const double& jd) const
{
    // If no date was supplied, or if the date hasnt changed, do nothing
    if ((jd < -1.0e29) || (jd == cached_jd_)) {
        return ;
    } else if (algorithm_type_ == CEPlanetAlgo::JPL) {
        Update_JPL(jd) ;
    } else if (algorithm_type_ == CEPlanetAlgo::SOFA) {
        Update_SOFA(jd) ;
    }
}